

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

int __thiscall
trieste::detail::InsideStar<5UL>::clone
          (InsideStar<5UL> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  InsideStar<5UL> *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  this_local = this;
  std::make_shared<trieste::detail::InsideStar<5ul>,trieste::detail::InsideStar<5ul>const&>
            ((InsideStar<5UL> *)&stack0xffffffffffffffd8);
  std::shared_ptr<trieste::detail::PatternDef>::shared_ptr<trieste::detail::InsideStar<5ul>,void>
            ((shared_ptr<trieste::detail::PatternDef> *)this,
             (shared_ptr<trieste::detail::InsideStar<5UL>_> *)&stack0xffffffffffffffd8);
  std::shared_ptr<trieste::detail::InsideStar<5UL>_>::~shared_ptr
            ((shared_ptr<trieste::detail::InsideStar<5UL>_> *)&stack0xffffffffffffffd8);
  return (int)this;
}

Assistant:

PatternPtr clone() const& override
      {
        return std::make_shared<InsideStar>(*this);
      }